

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void __thiscall obs::connection::disconnect(connection *this)

{
  if (this->m_slot != (slot_base *)0x0) {
    if (this->m_signal == (signal_base *)0x0) {
      __assert_fail("m_signal",
                    "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/obs/connection.cpp"
                    ,0x10,"void obs::connection::disconnect()");
    }
    (*this->m_signal->_vptr_signal_base[2])();
    if (this->m_slot != (slot_base *)0x0) {
      (*this->m_slot->_vptr_slot_base[1])();
    }
    this->m_slot = (slot_base *)0x0;
  }
  return;
}

Assistant:

void connection::disconnect() {
  if (!m_slot)
    return;

  assert(m_signal);
  if (m_signal)
    m_signal->disconnect_slot(m_slot);

  delete m_slot;
  m_slot = nullptr;
}